

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O1

Symbol * dyn_entry(GlobalVars *gv,DynArg arg,int entrytype)

{
  _func_Symbol_ptr_GlobalVars_ptr_DynArg_int *UNRECOVERED_JUMPTABLE;
  Symbol *pSVar1;
  
  make_dynobj(gv);
  UNRECOVERED_JUMPTABLE = fff[gv->dest_format]->dynentry;
  if (UNRECOVERED_JUMPTABLE != (_func_Symbol_ptr_GlobalVars_ptr_DynArg_int *)0x0) {
    pSVar1 = (*UNRECOVERED_JUMPTABLE)(gv,arg.sym,entrytype);
    return pSVar1;
  }
  error(0x7e,fff[gv->dest_format]->tname);
  return (Symbol *)0x0;
}

Assistant:

static struct Symbol *dyn_entry(struct GlobalVars *gv,DynArg arg,int entrytype)
{
  make_dynobj(gv);

  if (fff[gv->dest_format]->dynentry)
    return fff[gv->dest_format]->dynentry(gv,arg,entrytype);
  
  /* dynamic symbol reference not supported by target */
  error(126,fff[gv->dest_format]->tname);
  return NULL;
}